

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void raviV_settable_i(lua_State *L,TValue *t,TValue *key,StkId val)

{
  LuaType LVar1;
  ushort uVar2;
  Table *t_00;
  GCObject *pGVar3;
  RaviArray *pRVar4;
  TValue *slot;
  ulong uVar5;
  char *pcVar6;
  Value VVar7;
  lua_Number value;
  double dVar8;
  undefined1 auVar9 [16];
  
  LVar1 = t->tt_;
  if (LVar1 == 0x8005) {
    if (key->tt_ == 0x13) {
      t_00 = (Table *)(t->value_).gc;
      if (t_00->tt == '\x05') {
        uVar5 = (key->value_).i - 1;
        if (uVar5 < t_00->sizearray) {
          slot = t_00->array + uVar5;
        }
        else {
          slot = luaH_getint(t_00,(key->value_).i);
        }
        if (slot->tt_ == 0) goto LAB_00135640;
        pGVar3 = (val->value_).gc;
        (slot->value_).gc = pGVar3;
        uVar2 = val->tt_;
        slot->tt_ = uVar2;
        if (-1 < (short)uVar2) {
          return;
        }
        if (((uVar2 & 0x7f) == (ushort)pGVar3->tt) &&
           ((L == (lua_State *)0x0 || ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) == 0)))) {
          if ((t_00->tt & 0xe) < 10) {
            if ((t_00->marked & 0x20) == 0) {
              return;
            }
            if ((((val->value_).gc)->marked & 0x18) == 0) {
              return;
            }
            luaC_barrierback_(L,(GCObject *)t_00);
            return;
          }
          pcVar6 = "(((h)->tt) & 0x0F) < (9+1)";
        }
        else {
          pcVar6 = "0";
        }
      }
      else {
        pcVar6 = "(((t)->value_).gc)->tt == 5";
      }
      goto LAB_00135804;
    }
  }
  else if (LVar1 == 0x8025) {
    pRVar4 = (RaviArray *)(t->value_).gc;
    if ((pRVar4->tt != '\x15') && (pRVar4->tt != '%')) {
LAB_0013581c:
      pcVar6 = 
      "((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_00135804;
    }
    if (val->tt_ == 0x13) {
      if (key->tt_ == 0x13) {
        uVar5 = (key->value_).i & 0xffffffff;
        if (pRVar4->len <= (uint)(key->value_).b) {
          value = (lua_Number)(val->value_).i;
LAB_00135759:
          raviH_set_float(L,pRVar4,uVar5,value);
          return;
        }
        VVar7.n = (lua_Number)(val->value_).i;
LAB_0013572b:
        *(Value *)(pRVar4->data + uVar5 * 8) = VVar7;
        return;
      }
    }
    else {
      if (val->tt_ != 3) {
        pcVar6 = "value cannot be converted to number";
        goto LAB_00135835;
      }
      if (key->tt_ == 0x13) {
        uVar5 = (key->value_).i & 0xffffffff;
        if (pRVar4->len <= (uint)(key->value_).b) {
          value = (val->value_).n;
          goto LAB_00135759;
        }
        VVar7 = val->value_;
        goto LAB_0013572b;
      }
    }
  }
  else {
    if (LVar1 != 0x8015) {
      slot = (TValue *)0x0;
LAB_00135640:
      luaV_finishset(L,t,key,val,slot);
      return;
    }
    pRVar4 = (RaviArray *)(t->value_).gc;
    if ((pRVar4->tt != '\x15') && (pRVar4->tt != '%')) goto LAB_0013581c;
    if (val->tt_ == 3) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (val->value_).n;
      auVar9 = vroundsd_avx(auVar9,auVar9,9);
      dVar8 = auVar9._0_8_;
      if (((dVar8 != (val->value_).n) || (dVar8 < -9.223372036854776e+18)) ||
         (9.223372036854776e+18 <= dVar8)) goto LAB_00135825;
      if (key->tt_ == 0x13) {
        VVar7.i = (lua_Integer)dVar8;
        uVar5 = (key->value_).i & 0xffffffff;
        if (pRVar4->len <= (uint)(key->value_).b) goto LAB_001357d1;
        pcVar6 = pRVar4->data;
        goto LAB_001357c0;
      }
    }
    else {
      if (val->tt_ != 0x13) {
LAB_00135825:
        pcVar6 = "value cannot be converted to integer";
LAB_00135835:
        luaG_runerror(L,pcVar6);
      }
      if (key->tt_ == 0x13) {
        uVar5 = (key->value_).i & 0xffffffff;
        if (pRVar4->len <= (uint)(key->value_).b) {
          VVar7 = (Value)(val->value_).i;
LAB_001357d1:
          raviH_set_int(L,pRVar4,uVar5,VVar7.i);
          return;
        }
        pcVar6 = pRVar4->data;
        VVar7 = val->value_;
LAB_001357c0:
        *(Value *)(pcVar6 + uVar5 * 8) = VVar7;
        return;
      }
    }
  }
  pcVar6 = "((((key))->tt_) == (((3) | ((1) << 4))))";
LAB_00135804:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0xc7b,"void raviV_settable_i(lua_State *, const TValue *, TValue *, StkId)");
}

Assistant:

void raviV_settable_i(lua_State *L, const TValue *t, TValue *key, StkId val) {
  SETTABLE_INLINE_I(L, t, key, val);
}